

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O2

int main(void)

{
  int iVar1;
  CMUnitTest tests [14];
  
  memcpy(tests,&PTR_anon_var_dwarf_64_0010cba0,0x230);
  iVar1 = _cmocka_run_group_tests("tests",tests,0xe,(CMFixtureFunction)0x0,(CMFixtureFunction)0x0);
  return iVar1;
}

Assistant:

int main() {
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(test_set_to_val),
        cmocka_unit_test(test_construct),
        cmocka_unit_test(test_union_intersection),
        cmocka_unit_test(test_iterate),
        cmocka_unit_test(test_iterate2),
        cmocka_unit_test(test_next_bits_iterate),
        cmocka_unit_test(test_max_min),
        cmocka_unit_test(test_counts),
        cmocka_unit_test(test_shift_right),
        cmocka_unit_test(test_shift_left),
        cmocka_unit_test(test_disjoint),
        cmocka_unit_test(test_intersects),
        cmocka_unit_test(test_contains_all),
        cmocka_unit_test(test_contains_all_different_sizes),
    };

    return cmocka_run_group_tests(tests, NULL, NULL);
}